

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::read_content_core
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res,
          ContentReceiver *receiver,MultipartContentHeader *mulitpart_header,
          MultipartContentReceiver *multipart_receiver)

{
  size_t payload_max_length;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  string boundary;
  MultipartFormDataParser multipart_form_data_parser;
  _Any_data local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  _Any_data local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  string local_1c8;
  function<bool_(const_char_*,_unsigned_long)> local_1a8;
  string local_188;
  anon_class_24_3_23d8765b local_168;
  undefined1 local_150 [136];
  size_t local_c8;
  
  detail::MultipartFormDataParser::MultipartFormDataParser((MultipartFormDataParser *)local_150);
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_208._M_unused._M_object = (void *)0x0;
  local_208._8_8_ = 0;
  bVar1 = Request::is_multipart_form_data(req);
  if (bVar1) {
    Request::get_header_value_abi_cxx11_(&local_188,req,"Content-Type",0);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    local_1c8._M_string_length = 0;
    local_1c8.field_2._M_local_buf[0] = '\0';
    bVar1 = detail::parse_multipart_boundary(&local_188,&local_1c8);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)(local_150 + 0x40));
      local_168.multipart_receiver = multipart_receiver;
      local_168.mulitpart_header = mulitpart_header;
      local_168.multipart_form_data_parser = (MultipartFormDataParser *)local_150;
      std::function<bool(char_const*,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long)> *)local_208._M_pod_data,&local_168);
    }
    else {
      res->status = 400;
      bVar2 = write_response(this,strm,last_connection,req,res);
      receiver = (ContentReceiver *)(ulong)bVar2;
    }
    bVar3 = (byte)receiver;
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_188);
    if (!bVar1) goto LAB_001650cc;
  }
  else {
    std::function<bool_(const_char_*,_unsigned_long)>::operator=
              ((function<bool_(const_char_*,_unsigned_long)> *)&local_208,receiver);
  }
  payload_max_length = this->payload_max_length_;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8._M_unused._M_object = (void *)0x0;
  local_1e8._8_8_ = 0;
  std::function<bool_(const_char_*,_unsigned_long)>::function
            (&local_1a8,(function<bool_(const_char_*,_unsigned_long)> *)&local_208);
  bVar1 = detail::read_content<httplib::Request>
                    (strm,req,payload_max_length,&res->status,(Progress *)&local_1e8,&local_1a8);
  std::_Function_base::~_Function_base(&local_1a8.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
  if (bVar1) {
    bVar1 = Request::is_multipart_form_data(req);
    bVar3 = 1;
    if (!bVar1 || local_c8 != 0) goto LAB_001650cc;
    res->status = 400;
  }
  bVar3 = write_response(this,strm,last_connection,req,res);
LAB_001650cc:
  std::_Function_base::~_Function_base((_Function_base *)&local_208);
  detail::MultipartFormDataParser::~MultipartFormDataParser((MultipartFormDataParser *)local_150);
  return (bool)(bVar3 & 1);
}

Assistant:

inline bool
Server::read_content_core(Stream &strm, bool last_connection,
                          Request &req, Response &res,
                          ContentReceiver receiver,
                          MultipartContentHeader mulitpart_header,
                          MultipartContentReceiver multipart_receiver) {
  detail::MultipartFormDataParser multipart_form_data_parser;
  ContentReceiver out;

  if (req.is_multipart_form_data()) {
    const auto &content_type = req.get_header_value("Content-Type");
    std::string boundary;
    if (!detail::parse_multipart_boundary(content_type, boundary)) {
      res.status = 400;
      return write_response(strm, last_connection, req, res);
    }

    multipart_form_data_parser.set_boundary(boundary);
    out = [&](const char *buf, size_t n) {
      return multipart_form_data_parser.parse(buf, n, multipart_receiver, mulitpart_header);
    };
  } else {
    out = receiver;
  }

  if (!detail::read_content(strm, req, payload_max_length_, res.status,
                            Progress(), out)) {
    return write_response(strm, last_connection, req, res);
  }

  if (req.is_multipart_form_data()) {
    if (!multipart_form_data_parser.is_valid()) {
      res.status = 400;
      return write_response(strm, last_connection, req, res);
    }
  }

  return true;
}